

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PlayerStrategy.cpp
# Opt level: O0

void __thiscall AggressiveBotStrategy::AggressiveBotStrategy(AggressiveBotStrategy *this)

{
  int *piVar1;
  string *this_00;
  allocator<char> local_1d [13];
  AggressiveBotStrategy *local_10;
  AggressiveBotStrategy *this_local;
  
  local_10 = this;
  PlayerStrategy::PlayerStrategy(&this->super_PlayerStrategy);
  (this->super_PlayerStrategy)._vptr_PlayerStrategy = (_func_int **)&PTR_yesOrNo_00168968;
  piVar1 = (int *)operator_new(4);
  *piVar1 = 0;
  (this->super_PlayerStrategy).armiesToPlace = piVar1;
  piVar1 = (int *)operator_new(4);
  *piVar1 = 0;
  (this->super_PlayerStrategy).exchangingCardType = piVar1;
  (this->super_PlayerStrategy).player = (Player *)0x0;
  (this->super_PlayerStrategy).from = (Country *)0x0;
  (this->super_PlayerStrategy).to = (Country *)0x0;
  this_00 = (string *)operator_new(0x20);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)this_00,"AGGRESSIVE",local_1d);
  (this->super_PlayerStrategy).strategyName = this_00;
  std::allocator<char>::~allocator(local_1d);
  return;
}

Assistant:

AggressiveBotStrategy::AggressiveBotStrategy() {
    this->armiesToPlace = new int(0);
    this->exchangingCardType = new int(0);
    this->player = nullptr;
    this->from = nullptr;
    this->to = nullptr;
    this->strategyName = new std::string("AGGRESSIVE");
}